

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O3

bool __thiscall
perfetto::protos::gen::ChromeContentSettingsEventInfo::ParseFromArray
          (ChromeContentSettingsEventInfo *this,void *raw,size_t size)

{
  byte bVar1;
  bool bVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  ulong *puVar6;
  uint8_t cur_byte_1;
  ulong uVar7;
  ulong *puVar8;
  uint uVar9;
  uint8_t cur_byte_2;
  ulong *puVar10;
  ulong uVar11;
  uint8_t cur_byte;
  ulong *puVar12;
  Field local_40;
  
  (this->unknown_fields_)._M_string_length = 0;
  *(this->unknown_fields_)._M_dataplus._M_p = '\0';
  puVar6 = (ulong *)(size + (long)raw);
  local_40.int_value_ = 0;
LAB_0024038b:
  if (puVar6 <= raw) goto switchD_002403da_caseD_3;
  bVar1 = (byte)*raw;
  uVar7 = (ulong)bVar1;
  puVar10 = (ulong *)((long)raw + 1);
  if ((char)bVar1 < '\0') {
    uVar7 = (ulong)(bVar1 & 0x7f);
    lVar4 = 7;
    do {
      if ((puVar6 <= puVar10) || (0x38 < lVar4 - 7U)) goto switchD_002403da_caseD_3;
      uVar11 = *puVar10;
      puVar10 = (ulong *)((long)puVar10 + 1);
      uVar7 = uVar7 | (ulong)((byte)uVar11 & 0x7f) << ((byte)lVar4 & 0x3f);
      lVar4 = lVar4 + 7;
    } while ((char)(byte)uVar11 < '\0');
  }
  uVar9 = (uint)(uVar7 >> 3);
  if ((uVar9 == 0) || (puVar6 <= puVar10)) goto switchD_002403da_caseD_3;
  switch((uint)uVar7 & 7) {
  case 0:
    uVar11 = 0;
    uVar3 = 0;
    while( true ) {
      puVar12 = (ulong *)((long)puVar10 + 1);
      uVar11 = (ulong)((byte)*puVar10 & 0x7f) << ((byte)uVar3 & 0x3f) | uVar11;
      if (-1 < (char)(byte)*puVar10) break;
      if ((puVar6 <= puVar12) || (bVar2 = 0x38 < uVar3, uVar3 = uVar3 + 7, puVar10 = puVar12, bVar2)
         ) goto switchD_002403da_caseD_3;
    }
    uVar3 = uVar11 & 0xffffffff00000000;
LAB_002404af:
    uVar5 = 0;
LAB_002404b1:
    raw = puVar12;
    if ((uVar9 < 0x10000) && (uVar5 < 0x10000000)) {
      local_40.int_value_ = uVar3 | uVar11 & 0xffffffff;
      uVar7 = uVar5 | (uVar7 >> 3) << 0x20 | (uVar7 & 7) << 0x30;
LAB_00240550:
LAB_00240560:
      local_40.size_ = (uint32_t)uVar7;
      local_40.type_ = (uint8_t)(uVar7 >> 0x30);
      local_40.id_ = (uint16_t)(uVar7 >> 0x20);
      puVar10 = puVar12;
      if (local_40.id_ == 1) {
        *(byte *)&(this->_has_field_).super__Base_bitset<1UL>._M_w =
             (byte)(this->_has_field_).super__Base_bitset<1UL>._M_w | 2;
        this->number_of_exceptions_ = (uint32_t)local_40.int_value_;
      }
      else {
        if ((uVar7 & 0xffff00000000) == 0) {
          return puVar6 == puVar12;
        }
        protozero::Field::SerializeAndAppendToInternal<std::__cxx11::string>
                  (&local_40,&this->unknown_fields_);
      }
LAB_00240606:
      if (puVar6 <= puVar10) goto switchD_00240650_caseD_3;
      bVar1 = (byte)*puVar10;
      uVar7 = (ulong)(uint)bVar1;
      puVar8 = (ulong *)((long)puVar10 + 1);
      if ((char)bVar1 < '\0') {
        uVar7 = (ulong)(bVar1 & 0x7f);
        lVar4 = 7;
        do {
          if ((puVar6 <= puVar8) || (0x38 < lVar4 - 7U)) goto switchD_00240650_caseD_3;
          uVar11 = *puVar8;
          puVar8 = (ulong *)((long)puVar8 + 1);
          uVar7 = uVar7 | (ulong)((byte)uVar11 & 0x7f) << ((byte)lVar4 & 0x3f);
          lVar4 = lVar4 + 7;
        } while ((char)(byte)uVar11 < '\0');
      }
      uVar9 = (uint)(uVar7 >> 3);
      if ((uVar9 == 0) || (puVar6 <= puVar8)) goto switchD_00240650_caseD_3;
      switch((uint)uVar7 & 7) {
      case 0:
        uVar11 = 0;
        uVar3 = 0;
        while( true ) {
          puVar12 = (ulong *)((long)puVar8 + 1);
          uVar11 = (ulong)((byte)*puVar8 & 0x7f) << ((byte)uVar3 & 0x3f) | uVar11;
          if (-1 < (char)(byte)*puVar8) break;
          if ((puVar6 <= puVar12) ||
             (bVar2 = 0x38 < uVar3, uVar3 = uVar3 + 7, puVar8 = puVar12, bVar2))
          goto switchD_00240650_caseD_3;
        }
        local_40.int_value_ = uVar11 & 0xffffffff00000000;
LAB_00240721:
        uVar3 = 0;
LAB_00240723:
        puVar10 = puVar12;
        if ((0xffff < uVar9) || (0xfffffff < uVar3)) goto LAB_00240606;
        local_40.int_value_ = local_40.int_value_ | uVar11 & 0xffffffff;
        uVar7 = uVar3 | (uVar7 >> 3) << 0x20 | (uVar7 & 7) << 0x30;
        goto LAB_00240560;
      case 1:
        puVar12 = puVar8 + 1;
        if (puVar12 <= puVar6) {
          uVar11 = *puVar8;
          local_40.int_value_ = uVar11 & 0xffffffff00000000;
          goto LAB_00240721;
        }
        break;
      case 2:
        puVar8 = (ulong *)((long)puVar8 + 1);
        uVar3 = 0;
        uVar11 = 0;
        puVar12 = puVar8;
        while (uVar3 = (ulong)(*(byte *)((long)puVar12 + -1) & 0x7f) << ((byte)uVar11 & 0x3f) |
                       uVar3, (char)*(byte *)((long)puVar12 + -1) < '\0') {
          if (puVar6 <= puVar12) goto switchD_00240650_caseD_3;
          puVar12 = (ulong *)((long)puVar12 + 1);
          puVar8 = (ulong *)((long)puVar8 + 1);
          bVar2 = 0x38 < uVar11;
          uVar11 = uVar11 + 7;
          if (bVar2) goto switchD_00240650_caseD_3;
        }
        if (uVar3 <= (ulong)((long)puVar6 - (long)puVar8)) {
          local_40.int_value_ = (ulong)puVar8 & 0xffffffff00000000;
          puVar12 = (ulong *)((long)puVar12 + uVar3);
          uVar11 = (ulong)puVar8 & 0xffffffff;
          goto LAB_00240723;
        }
        break;
      case 5:
        puVar12 = (ulong *)((long)puVar8 + 4);
        if (puVar12 <= puVar6) {
          uVar11 = (ulong)(uint)*puVar8;
          local_40.int_value_ = 0;
          goto LAB_00240721;
        }
      }
switchD_00240650_caseD_3:
      local_40.int_value_ = 0;
      uVar7 = 0;
      puVar12 = puVar10;
      goto LAB_00240560;
    }
    goto LAB_0024038b;
  case 1:
    puVar12 = puVar10 + 1;
    if (puVar12 <= puVar6) {
      uVar11 = *puVar10;
      uVar3 = uVar11 & 0xffffffff00000000;
      goto LAB_002404af;
    }
    break;
  case 2:
    puVar10 = (ulong *)((long)puVar10 + 1);
    uVar5 = 0;
    uVar11 = 0;
    puVar12 = puVar10;
    while (uVar5 = (ulong)(*(byte *)((long)puVar12 + -1) & 0x7f) << ((byte)uVar11 & 0x3f) | uVar5,
          (char)*(byte *)((long)puVar12 + -1) < '\0') {
      if (puVar6 <= puVar12) goto switchD_002403da_caseD_3;
      puVar12 = (ulong *)((long)puVar12 + 1);
      puVar10 = (ulong *)((long)puVar10 + 1);
      bVar2 = 0x38 < uVar11;
      uVar11 = uVar11 + 7;
      if (bVar2) goto switchD_002403da_caseD_3;
    }
    if (uVar5 <= (ulong)((long)puVar6 - (long)puVar10)) {
      uVar3 = (ulong)puVar10 & 0xffffffff00000000;
      puVar12 = (ulong *)((long)puVar12 + uVar5);
      uVar11 = (ulong)puVar10 & 0xffffffff;
      goto LAB_002404b1;
    }
    break;
  case 5:
    puVar12 = (ulong *)((long)puVar10 + 4);
    if (puVar12 <= puVar6) {
      uVar11 = (ulong)(uint)*puVar10;
      uVar3 = 0;
      goto LAB_002404af;
    }
  }
switchD_002403da_caseD_3:
  uVar7 = 0;
  puVar12 = (ulong *)raw;
  goto LAB_00240550;
}

Assistant:

bool ChromeContentSettingsEventInfo::ParseFromArray(const void* raw, size_t size) {
  unknown_fields_.clear();
  bool packed_error = false;

  ::protozero::ProtoDecoder dec(raw, size);
  for (auto field = dec.ReadField(); field.valid(); field = dec.ReadField()) {
    if (field.id() < _has_field_.size()) {
      _has_field_.set(field.id());
    }
    switch (field.id()) {
      case 1 /* number_of_exceptions */:
        field.get(&number_of_exceptions_);
        break;
      default:
        field.SerializeAndAppendTo(&unknown_fields_);
        break;
    }
  }
  return !packed_error && !dec.bytes_left();
}